

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O1

bool ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert(string *v,RepType *r)

{
  uint uVar1;
  ulong uVar2;
  RealType RVar3;
  StringTokenizer tokenizer;
  allocator_type local_a9;
  string local_a8;
  value_type_conflict1 local_88;
  StringTokenizer local_80;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"calling tokenizer\n",0x12);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," ();,\t\n\r","");
  OpenMD::StringTokenizer::StringTokenizer(&local_80,v,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  uVar1 = OpenMD::StringTokenizer::countTokens(&local_80);
  local_88 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a8,(ulong)uVar1,&local_88,&local_a9);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(r,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_a8._M_dataplus._M_p,
                    local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      RVar3 = OpenMD::StringTokenizer::nextTokenAsDouble(&local_80);
      (r->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar2] = RVar3;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    std::cerr << "calling tokenizer\n";
    OpenMD::StringTokenizer tokenizer(v, " ();,\t\n\r");
    unsigned int size = tokenizer.countTokens();
    r                 = std::vector<RealType>(size, 0.0);
    for (unsigned int i = 0; i < size; i++) {
      RealType v = tokenizer.nextTokenAsDouble();
      r[i]       = v;
    }
    return true;
  }